

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageOneofFieldGenerator::GenerateBuildingCode
          (ImmutableMessageOneofFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  ImmutableMessageOneofFieldGenerator *this_local;
  
  io::Printer::Print(printer,&(this->super_ImmutableMessageFieldGenerator).variables_,
                     "if ($has_oneof_case_message$) {\n");
  io::Printer::Indent(printer);
  ImmutableMessageFieldGenerator::PrintNestedBuilderCondition
            (&this->super_ImmutableMessageFieldGenerator,printer,
             "result.$oneof_name$_ = $oneof_name$_;\n",
             "result.$oneof_name$_ = $name$Builder_.build();\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  return;
}

Assistant:

void ImmutableMessageOneofFieldGenerator::GenerateBuildingCode(
    io::Printer* printer) const {
  printer->Print(variables_, "if ($has_oneof_case_message$) {\n");
  printer->Indent();

  PrintNestedBuilderCondition(
      printer, "result.$oneof_name$_ = $oneof_name$_;\n",

      "result.$oneof_name$_ = $name$Builder_.build();\n");

  printer->Outdent();
  printer->Print("}\n");
}